

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::CallRegExFunction<2>
              (RecyclableObject *fnObj,Var regExp,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *this;
  bool bVar1;
  Attributes attributes;
  Var pvVar2;
  JavascriptMethod p_Var3;
  Var pvVar4;
  RecyclableObject *ptr;
  Arguments local_48;
  bool local_32;
  ImplicitCallFlags local_31;
  
  local_48.Info = args->Info;
  if ((local_48.Info._0_4_ & 0xffffff) < 3) {
    pvVar2 = CallRegExFunction<1>(fnObj,regExp,args,scriptContext);
    return pvVar2;
  }
  this = scriptContext->threadContext;
  local_48.Values = args->Values;
  local_32 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(fnObj);
  bVar1 = ThreadContext::HasNoSideEffect(this,fnObj,attributes);
  if (bVar1) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    CheckIsExecutable(fnObj,p_Var3);
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    pvVar2 = Arguments::operator[](&local_48,0);
    pvVar4 = Arguments::operator[](&local_48,2);
    ptr = (RecyclableObject *)
          (*p_Var3)(fnObj,(CallInfo)fnObj,0x2000003,0,0,0,0,0x2000003,regExp,pvVar2,pvVar4);
    bVar1 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((fnObj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00d26009;
    }
    if ((attributes & HasNoSideEffect) == None) {
      local_31 = this->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (this->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
      CheckIsExecutable(fnObj,p_Var3);
      p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
      pvVar2 = Arguments::operator[](&local_48,0);
      pvVar4 = Arguments::operator[](&local_48,2);
      ptr = (RecyclableObject *)
            (*p_Var3)(fnObj,(CallInfo)fnObj,0x2000003,0,0,0,0,0x2000003,regExp,pvVar2,pvVar4);
      this->implicitCallFlags = local_31 | ImplicitCall_Accessor;
      goto LAB_00d26009;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    CheckIsExecutable(fnObj,p_Var3);
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    pvVar2 = Arguments::operator[](&local_48,0);
    pvVar4 = Arguments::operator[](&local_48,2);
    ptr = (RecyclableObject *)
          (*p_Var3)(fnObj,(CallInfo)fnObj,0x2000003,0,0,0,0,0x2000003,regExp,pvVar2,pvVar4);
    bVar1 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar1 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00d26009:
  this->reentrancySafeOrHandled = local_32;
  return ptr;
}

Assistant:

Var JavascriptString::CallRegExFunction<2>(RecyclableObject* fnObj, Var regExp, Arguments& args, ScriptContext * scriptContext)
    {
        // args[0]: String
        // args[1]: RegExp (ignored since we need to create one when the argument is "undefined")
        // args[2]: Var

        if (args.Info.Count < 3)
        {
            return CallRegExFunction<1>(fnObj, regExp, args, scriptContext);
        }

        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(fnObj, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, fnObj, CallInfo(CallFlags_Value, 3), regExp, args[0], args[2]);
        });
    }